

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_utils.cpp
# Opt level: O3

string * jsonnet::internal::path_dir_with_trailing_separator
                   (string *__return_storage_ptr__,string *path)

{
  long lVar1;
  
  lVar1 = std::__cxx11::string::find_last_of((char *)path,0x20fbd0,0xffffffffffffffff);
  if (lVar1 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)path);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string path_dir_with_trailing_separator(const std::string &path) {
    size_t last_slash = path.find_last_of(DIR_SEPARATORS);
    if (last_slash != std::string::npos) {
        return path.substr(0, last_slash + 1);
    }
    return "";
}